

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O0

bool __thiscall ChebTools::ChebyshevExpansion::is_monotonic(ChebyshevExpansion *this)

{
  bool bVar1;
  bool local_1aa;
  Scalar local_1a0;
  RCmpLTReturnType local_198;
  Scalar local_168;
  CmpLTReturnType local_160;
  Type local_130;
  Type local_e8;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
  local_b0;
  undefined1 local_38 [8];
  ArrayXd diff;
  Index N;
  VectorXd yvals;
  ChebyshevExpansion *this_local;
  
  yvals.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       (Index)this;
  get_node_function_values((ChebyshevExpansion *)&N);
  diff.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                 ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&N);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::tail<long>
            (&local_e8,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&N,
             diff.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows +
             -1);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::head<long>
            (&local_130,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&N,
             diff.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows +
             -1);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>::operator-
            (&local_b0,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>> *)&local_e8,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
             &local_130);
  Eigen::Array<double,-1,1,0,-1,1>::
  Array<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>const,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>const>>
            ((Array<double,_1,1,0,_1,1> *)local_38,&local_b0);
  local_168 = 0.0;
  Eigen::ArrayBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>::operator<
            (&local_160,(ArrayBase<Eigen::Array<double,__1,_1,_0,__1,_1>_> *)local_38,&local_168);
  bVar1 = Eigen::
          DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)1>,_const_Eigen::Array<double,_-1,_1,_0,_-1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,_-1,_1,_0,_-1,_1>_>_>_>
          ::all((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)1>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>_>
                 *)&local_160);
  local_1aa = true;
  if (!bVar1) {
    local_1a0 = 0.0;
    Eigen::ArrayBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>::operator>
              (&local_198,(ArrayBase<Eigen::Array<double,__1,_1,_0,__1,_1>_> *)local_38,&local_1a0);
    local_1aa = Eigen::
                DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Array<double,_-1,_1,_0,_-1,_1>_>_>
                ::all((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
                       *)&local_198);
  }
  Eigen::Array<double,_-1,_1,_0,_-1,_1>::~Array((Array<double,__1,_1,_0,__1,_1> *)local_38);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)&N);
  return local_1aa;
}

Assistant:

bool ChebyshevExpansion::is_monotonic() const {
        auto yvals = get_node_function_values();
        auto N = yvals.size();
        Eigen::ArrayXd diff = yvals.tail(N - 1) - yvals.head(N - 1);
        return (diff < 0.0).all() || (diff > 0.0).all();
    }